

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O3

int UnityGetAudioEffectDefinitions(UnityAudioEffectDefinition ***definitionptr)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  UnityAudioEffectDefinition *pUVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  long lVar8;
  
  if (UnityGetAudioEffectDefinitions::numeffects == 0) {
    UnityGetAudioEffectDefinitions::numeffects = 1;
    UnityGetAudioEffectDefinitions::definition[0].name[0xf] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[0].channels = 0;
    UnityGetAudioEffectDefinitions::definition[0].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[0].flags = 0;
    UnityGetAudioEffectDefinitions::definition[0].name[0x10] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x11] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x12] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x13] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x14] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x15] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x16] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x17] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x18] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x19] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x1a] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x1b] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x1c] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x1d] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x1e] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[0].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[0].paramdefs = (UnityAudioParameterDefinition *)0x0;
    builtin_strncpy((char *)&UnityGetAudioEffectDefinitions::definition[0].structsize,
                    "Demo Equalizer",0xf);
    UnityGetAudioEffectDefinitions::definition[0].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[0].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[0].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[0].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[0].create = Equalizer::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[0].release = Equalizer::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[0].process = Equalizer::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[0].setfloatparameter =
         Equalizer::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[0].getfloatparameter =
         Equalizer::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[0].getfloatbuffer = Equalizer::GetFloatBufferCallback
    ;
    Equalizer::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Imp",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"actGener",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 0xd,"nerator",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = ImpactGenerator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = ImpactGenerator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = ImpactGenerator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         ImpactGenerator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         ImpactGenerator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         ImpactGenerator::GetFloatBufferCallback;
    ImpactGenerator::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Imp",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"ulseGene",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 0xe,"nerator",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = ImpulseGenerator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = ImpulseGenerator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = ImpulseGenerator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         ImpulseGenerator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         ImpulseGenerator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         ImpulseGenerator::GetFloatBufferCallback;
    ImpulseGenerator::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Lev",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"elMixer",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = LevelMixer::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = LevelMixer::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = LevelMixer::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         LevelMixer::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         LevelMixer::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         LevelMixer::GetFloatBufferCallback;
    LevelMixer::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4)
    ;
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Lof",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 7,"finator",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = Lofinator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = Lofinator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = Lofinator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         Lofinator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         Lofinator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         Lofinator::GetFloatBufferCallback;
    Lofinator::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Mod",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"alFilter",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].name[0x10] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = ModalFilter::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = ModalFilter::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = ModalFilter::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         ModalFilter::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         ModalFilter::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         ModalFilter::GetFloatBufferCallback;
    ModalFilter::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Mul",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 7,"ltiband",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = Multiband::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = Multiband::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = Multiband::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         Multiband::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         Multiband::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         Multiband::GetFloatBufferCallback;
    Multiband::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Noi",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 6,"oiseBox",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = NoiseBox::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = NoiseBox::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = NoiseBox::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         NoiseBox::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         NoiseBox::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         NoiseBox::GetFloatBufferCallback;
    NoiseBox::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Pit",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"chDetect",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 0xf,"tor",4);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = PitchDetector::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = PitchDetector::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = PitchDetector::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         PitchDetector::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         PitchDetector::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         PitchDetector::GetFloatBufferCallback;
    PitchDetector::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Rin",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"gModulat",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 0xf,"tor",4);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = RingModulator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = RingModulator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = RingModulator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         RingModulator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         RingModulator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         RingModulator::GetFloatBufferCallback;
    RingModulator::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Ste",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"reoWiden",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 0xf,"ner",4);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = StereoWidener::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = StereoWidener::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = StereoWidener::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         StereoWidener::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         StereoWidener::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         StereoWidener::GetFloatBufferCallback;
    StereoWidener::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Tee",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 7,"eBee3o3",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = TeeBee::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = TeeBee::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = TeeBee::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         TeeBee::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         TeeBee::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         TeeBee::GetFloatBufferCallback;
    TeeBee::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Tee",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 7,"eDee9o9",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = TeeDee::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = TeeDee::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = TeeDee::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         TeeDee::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         TeeDee::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         TeeDee::GetFloatBufferCallback;
    TeeDee::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Tub",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"eResonat",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 0xf,"tor",4);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = TubeResonator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = TubeResonator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = TubeResonator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         TubeResonator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         TubeResonator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         TubeResonator::GetFloatBufferCallback;
    TubeResonator::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Voc",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 5,"Vocoder",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = Vocoder::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = Vocoder::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = Vocoder::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         Vocoder::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         Vocoder::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         Vocoder::GetFloatBufferCallback;
    Vocoder::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Wah",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"Wah",4);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = WahWah::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = WahWah::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = WahWah::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         WahWah::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         WahWah::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         WahWah::GetFloatBufferCallback;
    WahWah::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Con",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"volution",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 0xf,"nReverb",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = ConvolutionReverb::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = ConvolutionReverb::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = ConvolutionReverb::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         ConvolutionReverb::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         ConvolutionReverb::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         ConvolutionReverb::GetFloatBufferCallback;
    ConvolutionReverb::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Cor",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"relation",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 0xe,"onMeter",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = CorrelationMeter::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = CorrelationMeter::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = CorrelationMeter::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         CorrelationMeter::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         CorrelationMeter::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         CorrelationMeter::GetFloatBufferCallback;
    CorrelationMeter::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Gra",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"nulator",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = Granulator::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = Granulator::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = Granulator::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         Granulator::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         Granulator::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         Granulator::GetFloatBufferCallback;
    Granulator::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4)
    ;
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Lou",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"dnessMet",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 0xf,"ter",4);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = LoudnessMeter::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = LoudnessMeter::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = LoudnessMeter::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         LoudnessMeter::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         LoudnessMeter::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         LoudnessMeter::GetFloatBufferCallback;
    LoudnessMeter::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Osc",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"illoscop",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].name[0x10] = 'e';
    UnityGetAudioEffectDefinitions::definition[lVar4].name[0x11] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = Oscilloscope::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = Oscilloscope::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = Oscilloscope::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         Oscilloscope::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         Oscilloscope::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         Oscilloscope::GetFloatBufferCallback;
    Oscilloscope::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Rou",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 5,"Routing",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = Routing::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = Routing::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = Routing::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         Routing::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         Routing::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         Routing::GetFloatBufferCallback;
    Routing::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Spa",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"tializer",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].name[0x10] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = Spatializer::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = Spatializer::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = Spatializer::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         Spatializer::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         Spatializer::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         Spatializer::GetFloatBufferCallback;
    Spatializer::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Spa",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 8,"tializer",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 0x10," Reverb",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = SpatializerReverb::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = SpatializerReverb::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = SpatializerReverb::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         SpatializerReverb::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         SpatializerReverb::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         SpatializerReverb::GetFloatBufferCallback;
    SpatializerReverb::InternalRegisterEffectDefinition
              (UnityGetAudioEffectDefinitions::definition + lVar4);
    lVar4 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0] = '\0';
    pUVar5->name[1] = '\0';
    pUVar5->name[2] = '\0';
    pUVar5->name[3] = '\0';
    pUVar5->name[4] = '\0';
    pUVar5->name[5] = '\0';
    pUVar5->name[6] = '\0';
    pUVar5->name[7] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[8] = '\0';
    pUVar5->name[9] = '\0';
    pUVar5->name[10] = '\0';
    pUVar5->name[0xb] = '\0';
    pUVar5->name[0xc] = '\0';
    pUVar5->name[0xd] = '\0';
    pUVar5->name[0xe] = '\0';
    pUVar5->name[0xf] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].create = (UnityAudioEffect_CreateCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].release =
         (UnityAudioEffect_ReleaseCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].reset = (UnityAudioEffect_ResetCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].process =
         (UnityAudioEffect_ProcessCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].setposition =
         (UnityAudioEffect_SetPositionCallback)0x0;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramdefs =
         (UnityAudioParameterDefinition *)0x0;
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x10] = '\0';
    pUVar5->name[0x11] = '\0';
    pUVar5->name[0x12] = '\0';
    pUVar5->name[0x13] = '\0';
    pUVar5->name[0x14] = '\0';
    pUVar5->name[0x15] = '\0';
    pUVar5->name[0x16] = '\0';
    pUVar5->name[0x17] = '\0';
    pUVar5 = UnityGetAudioEffectDefinitions::definition + lVar4;
    pUVar5->name[0x18] = '\0';
    pUVar5->name[0x19] = '\0';
    pUVar5->name[0x1a] = '\0';
    pUVar5->name[0x1b] = '\0';
    pUVar5->name[0x1c] = '\0';
    pUVar5->name[0x1d] = '\0';
    pUVar5->name[0x1e] = '\0';
    pUVar5->name[0x1f] = '\0';
    UnityGetAudioEffectDefinitions::definition[lVar4].channels = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].numparameters = 0;
    UnityGetAudioEffectDefinitions::definition[lVar4].flags = 0;
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name,"Demo Tel",8);
    builtin_strncpy(UnityGetAudioEffectDefinitions::definition[lVar4].name + 6,"eleport",8);
    UnityGetAudioEffectDefinitions::definition[lVar4].structsize = 0x88;
    UnityGetAudioEffectDefinitions::definition[lVar4].paramstructsize = 0x40;
    UnityGetAudioEffectDefinitions::definition[lVar4].apiversion = 0x10402;
    UnityGetAudioEffectDefinitions::definition[lVar4].pluginversion = 0x10000;
    UnityGetAudioEffectDefinitions::definition[lVar4].create = Teleport::CreateCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].release = Teleport::ReleaseCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].process = Teleport::ProcessCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].setfloatparameter =
         Teleport::SetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatparameter =
         Teleport::GetFloatParameterCallback;
    UnityGetAudioEffectDefinitions::definition[lVar4].getfloatbuffer =
         Teleport::GetFloatBufferCallback;
    Teleport::InternalRegisterEffectDefinition(UnityGetAudioEffectDefinitions::definition + lVar4);
  }
  iVar3 = UnityGetAudioEffectDefinitions::numeffects;
  auVar2 = _DAT_0011c030;
  if (0 < UnityGetAudioEffectDefinitions::numeffects) {
    uVar1 = UnityGetAudioEffectDefinitions::numeffects + 1;
    lVar4 = (ulong)(uint)UnityGetAudioEffectDefinitions::numeffects - 1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    pUVar5 = UnityGetAudioEffectDefinitions::definition;
    lVar4 = 0;
    auVar6 = auVar6 ^ _DAT_0011c030;
    auVar7 = _DAT_0011c050;
    do {
      auVar9 = auVar7 ^ auVar2;
      if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                  auVar6._4_4_ < auVar9._4_4_) & 1)) {
        *(UnityAudioEffectDefinition **)((long)UnityGetAudioEffectDefinitions::definitionp + lVar4)
             = pUVar5;
      }
      if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
          auVar9._12_4_ <= auVar6._12_4_) {
        *(UnityAudioEffectDefinition **)
         ((long)UnityGetAudioEffectDefinitions::definitionp + lVar4 + 8) = pUVar5 + 1;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar4 = lVar4 + 0x10;
      pUVar5 = pUVar5 + 2;
    } while ((ulong)(uVar1 >> 1) << 4 != lVar4);
  }
  *definitionptr = UnityGetAudioEffectDefinitions::definitionp;
  return iVar3;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int AUDIO_CALLING_CONVENTION UnityGetAudioEffectDefinitions(UnityAudioEffectDefinition*** definitionptr)
{
    static UnityAudioEffectDefinition definition[256];
    static UnityAudioEffectDefinition* definitionp[256];
    static int numeffects = 0;
    if (numeffects == 0)
    {
        #include "PluginList.h"
    }
    for (int n = 0; n < numeffects; n++)
        definitionp[n] = &definition[n];
    *definitionptr = definitionp;
    return numeffects;
}